

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<9,_13,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Vec4 *local_b0;
  ulong local_a8;
  float local_a0 [6];
  float local_88 [4];
  Vector<float,_3> res_1;
  undefined8 local_6c;
  undefined4 local_64;
  Vector<float,_3> res_2;
  float fStack_54;
  Vector<float,_3> res;
  float fStack_40;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  undefined4 local_28;
  undefined8 uStack_20;
  float local_18 [3];
  float fStack_c;
  
  pfVar2 = res.m_data + 2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar3 = 0;
    lVar5 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar3 != lVar6) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar2 + lVar6) = uVar7;
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x40);
      lVar5 = lVar5 + 1;
      pfVar2 = pfVar2 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 != 4);
    fStack_40 = (float)*(undefined8 *)(evalCtx->in[0].m_data + 2);
    uVar1 = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    fStack_34 = (float)((ulong)*(undefined8 *)evalCtx->in[1].m_data >> 0x20);
    fStack_30 = (float)uVar1;
    fStack_2c = (float)((ulong)uVar1 >> 0x20);
    local_28 = (undefined4)*(undefined8 *)evalCtx->in[2].m_data;
    uStack_20 = *(undefined8 *)(evalCtx->in[2].m_data + 2);
    local_18._0_8_ = *(undefined8 *)evalCtx->in[3].m_data;
    fStack_c = (float)((ulong)*(undefined8 *)(evalCtx->in[3].m_data + 2) >> 0x20);
  }
  else {
    local_18[0] = 0.0;
    local_18[1] = 0.0;
    fStack_c = 0.0;
    local_28 = 0;
    uStack_20 = 0;
    fStack_34 = 0.0;
    fStack_30 = 0.0;
    fStack_2c = 0.0;
    puVar4 = &sr::(anonymous_namespace)::s_constInMat4x4;
    lVar3 = 0;
    do {
      lVar5 = 0;
      do {
        fStack_40 = 0.0;
        pfVar2[lVar5] = *(float *)((long)puVar4 + lVar5);
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      lVar3 = lVar3 + 1;
      pfVar2 = pfVar2 + 1;
      puVar4 = puVar4 + 4;
    } while (lVar3 != 4);
  }
  res.m_data[1] = fStack_40;
  res_2.m_data[0] = fStack_34;
  res_2.m_data[1] = fStack_30;
  res_2.m_data[2] = fStack_2c;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  lVar3 = 0;
  do {
    local_88[lVar3] = res.m_data[lVar3 + -1] + res_2.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_6c = uStack_20;
  local_64 = local_28;
  local_b0 = (Vec4 *)0x0;
  local_a8 = local_a8 & 0xffffffff00000000;
  lVar3 = 0;
  do {
    *(float *)((long)&local_b0 + lVar3 * 4) =
         local_88[lVar3] + *(float *)((long)&local_6c + lVar3 * 4);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  res_1.m_data[0] = fStack_c;
  res_1.m_data[1] = local_18[0];
  res_1.m_data[2] = local_18[1];
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  local_a0[4] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3 + 2] = *(float *)((long)&local_b0 + lVar3 * 4) + res_1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar3 * 4)] = local_a0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(in0);
	}